

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_output_stores_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef
          (EliminateDeadOutputStoresPass *this,Instruction *ref,Instruction *var)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t id;
  DecorationManager *this_00;
  TypeManager *this_01;
  Type *pTVar4;
  undefined4 extraout_var;
  long lVar5;
  Instruction *this_02;
  long *plVar6;
  uint32_t builtin;
  Instruction *local_88;
  LivenessManager *local_80;
  DefUseManager *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_88 = ref;
  this_00 = IRContext::get_decoration_mgr((this->super_Pass).context_);
  local_78 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  this_01 = IRContext::get_type_mgr((this->super_Pass).context_);
  local_80 = IRContext::get_liveness_mgr((this->super_Pass).context_);
  builtin = 0x7fffffff;
  uVar2 = Instruction::result_id(var);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:125:7)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:125:7)>
             ::_M_manager;
  local_50._M_unused._M_object = &builtin;
  analysis::DecorationManager::WhileEachDecoration
            (this_00,uVar2,0xb,(function<bool_(const_spvtools::opt::Instruction_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (builtin == 0x7fffffff) {
    if (local_88->opcode_ - OpPtrAccessChain < 0xfffffffe) {
      return;
    }
    uVar2 = Instruction::type_id(var);
    pTVar4 = analysis::TypeManager::GetType(this_01,uVar2);
    iVar3 = (*pTVar4->_vptr_Type[0x21])(pTVar4);
    plVar6 = *(long **)(CONCAT44(extraout_var,iVar3) + 0x28);
    lVar5 = (**(code **)(*plVar6 + 0xc0))(plVar6);
    if (lVar5 == 0) {
      uVar2 = 1;
    }
    else {
      plVar6 = *(long **)(lVar5 + 0x28);
      uVar2 = 2;
    }
    pTVar4 = (Type *)(**(code **)(*plVar6 + 0xf0))(plVar6);
    id = analysis::TypeManager::GetId(this_01,pTVar4);
    uVar2 = Instruction::GetSingleWordInOperand(local_88,uVar2);
    this_02 = analysis::DefUseManager::GetDef(local_78,uVar2);
    if (this_02->opcode_ != OpConstant) {
      __assert_fail("member_idx_inst->opcode() == spv::Op::OpConstant && \"unexpected non-constant index\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp"
                    ,0x9c,
                    "void spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(Instruction *, Instruction *)"
                   );
    }
    local_70._0_4_ = Instruction::GetSingleWordInOperand(this_02,0);
    local_70._4_4_ = 0;
    local_58 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:160:7)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:160:7)>
               ::_M_manager;
    local_70._8_8_ = &builtin;
    analysis::DecorationManager::WhileEachDecoration
              (this_00,id,0xb,(function<bool_(const_spvtools::opt::Instruction_&)> *)&local_70);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
    if (builtin == 0x7fffffff) {
      __assert_fail("builtin != uint32_t(spv::BuiltIn::Max) && \"builtin not found\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp"
                    ,0xac,
                    "void spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(Instruction *, Instruction *)"
                   );
    }
  }
  bVar1 = analysis::LivenessManager::IsAnalyzedBuiltin(local_80,builtin);
  if ((bVar1) && (bVar1 = IsLiveBuiltin(this,builtin), !bVar1)) {
    KillAllStoresOfRef(this,local_88);
  }
  return;
}

Assistant:

void EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(
    Instruction* ref, Instruction* var) {
  auto deco_mgr = context()->get_decoration_mgr();
  auto def_use_mgr = context()->get_def_use_mgr();
  auto type_mgr = context()->get_type_mgr();
  auto live_mgr = context()->get_liveness_mgr();
  // Search for builtin decoration of base variable
  uint32_t builtin = uint32_t(spv::BuiltIn::Max);
  auto var_id = var->result_id();
  (void)deco_mgr->WhileEachDecoration(
      var_id, uint32_t(spv::Decoration::BuiltIn),
      [&builtin](const Instruction& deco) {
        assert(deco.opcode() == spv::Op::OpDecorate && "unexpected decoration");
        builtin = deco.GetSingleWordInOperand(kOpDecorateBuiltInLiteralInIdx);
        return false;
      });
  // If analyzed builtin and not live, kill stores.
  if (builtin != uint32_t(spv::BuiltIn::Max)) {
    if (live_mgr->IsAnalyzedBuiltin(builtin) && !IsLiveBuiltin(builtin))
      KillAllStoresOfRef(ref);
    return;
  }
  // Search for builtin decoration on indexed member
  auto ref_op = ref->opcode();
  if (ref_op != spv::Op::OpAccessChain &&
      ref_op != spv::Op::OpInBoundsAccessChain) {
    return;
  }
  uint32_t in_idx = kOpAccessChainIdx0InIdx;
  analysis::Type* var_type = type_mgr->GetType(var->type_id());
  analysis::Pointer* ptr_type = var_type->AsPointer();
  auto curr_type = ptr_type->pointee_type();
  auto arr_type = curr_type->AsArray();
  if (arr_type) {
    curr_type = arr_type->element_type();
    ++in_idx;
  }
  auto str_type = curr_type->AsStruct();
  auto str_type_id = type_mgr->GetId(str_type);
  auto member_idx_id = ref->GetSingleWordInOperand(in_idx);
  auto member_idx_inst = def_use_mgr->GetDef(member_idx_id);
  assert(member_idx_inst->opcode() == spv::Op::OpConstant &&
         "unexpected non-constant index");
  auto ac_idx = member_idx_inst->GetSingleWordInOperand(kOpConstantValueInIdx);
  (void)deco_mgr->WhileEachDecoration(
      str_type_id, uint32_t(spv::Decoration::BuiltIn),
      [ac_idx, &builtin](const Instruction& deco) {
        assert(deco.opcode() == spv::Op::OpMemberDecorate &&
               "unexpected decoration");
        auto deco_idx =
            deco.GetSingleWordInOperand(kOpDecorateMemberMemberInIdx);
        if (deco_idx == ac_idx) {
          builtin =
              deco.GetSingleWordInOperand(kOpDecorateMemberBuiltInLiteralInIdx);
          return false;
        }
        return true;
      });
  assert(builtin != uint32_t(spv::BuiltIn::Max) && "builtin not found");
  // If analyzed builtin and not live, kill stores.
  if (live_mgr->IsAnalyzedBuiltin(builtin) && !IsLiveBuiltin(builtin))
    KillAllStoresOfRef(ref);
}